

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

void sysbvm_functionDefinition_ensureTypeAnalysis
               (sysbvm_context_t *context,sysbvm_functionDefinition_t **functionDefinition)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  sysbvm_functionDefinition_t *psVar3;
  sysbvm_tuple_t argumentNodes;
  sysbvm_tuple_t resultTypeNode;
  _Bool _Var4;
  sysbvm_tuple_t captureBindings;
  sysbvm_tuple_t argumentBindings;
  sysbvm_tuple_t localBindings;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  anon_struct_72_9_7cb38521 gcFrame;
  sysbvm_stackFrameRecord_t local_70;
  anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  _Var4 = sysbvm_tuple_isKindOf
                    (context,(sysbvm_tuple_t)*functionDefinition,
                     (context->roots).functionDefinitionType);
  if (_Var4) {
    sVar1 = (*functionDefinition)->sourceDefinition;
    if (((*(long *)(sVar1 + 0x20) != 0) && (*(long *)(sVar1 + 0x30) != 0)) &&
       ((*functionDefinition)->type == 0)) {
      gcFrame.analyzedBodyNode = 0;
      gcFrame.analyzedResultTypeNode = 0;
      gcFrame.analyzedArgumentNode = 0;
      gcFrame.analyzedArgumentsNode = 0;
      gcFrame.analysisEnvironment = 0;
      gcFrame.analysisEnvironmentObject = (sysbvm_functionAnalysisEnvironment_t *)0x0;
      gcFrame.sourceDefinition = (sysbvm_functionSourceDefinition_t *)0x0;
      gcFrame.sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t *)0x0;
      gcFrame.analyzedType = 0;
      local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
      local_58._12_4_ = 0;
      local_48 = 9;
      local_40 = (undefined1 *)&gcFrame;
      sysbvm_stackFrame_pushRecord(&local_58);
      gcFrame.sourceDefinition =
           (sysbvm_functionSourceDefinition_t *)(*functionDefinition)->sourceDefinition;
      gcFrame.sourceAnalyzedDefinition =
           (sysbvm_functionSourceAnalyzedDefinition_t *)
           (*functionDefinition)->sourceAnalyzedDefinition;
      if (gcFrame.sourceAnalyzedDefinition == (sysbvm_functionSourceAnalyzedDefinition_t *)0x0) {
        gcFrame.sourceAnalyzedDefinition =
             (sysbvm_functionSourceAnalyzedDefinition_t *)
             sysbvm_context_allocatePointerTuple
                       (context,(context->roots).functionSourceAnalyzedDefinitionType,8);
        local_60 = (anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1)
                   (gcFrame.sourceDefinition)->sourcePosition;
        *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)
         &(gcFrame.sourceAnalyzedDefinition)->sourcePosition = local_60;
        (*functionDefinition)->sourceAnalyzedDefinition =
             (sysbvm_tuple_t)gcFrame.sourceAnalyzedDefinition;
      }
      else {
        local_60 = (anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1)
                   (gcFrame.sourceAnalyzedDefinition)->sourcePosition;
      }
      local_70.previous = (sysbvm_stackFrameRecord_s *)0x0;
      local_70.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
      sysbvm_stackFrame_pushRecord(&local_70);
      gcFrame.analysisEnvironment =
           sysbvm_functionAnalysisEnvironment_create
                     (context,(gcFrame.sourceDefinition)->environment,
                      (sysbvm_tuple_t)*functionDefinition);
      uVar7 = (gcFrame.sourceDefinition)->argumentNodes;
      gcFrame.analysisEnvironmentObject =
           (sysbvm_functionAnalysisEnvironment_t *)gcFrame.analysisEnvironment;
      if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
        gcFrame.analyzedArgumentsNode = sysbvm_array_create(context,0);
      }
      else {
        uVar6 = *(uint *)(uVar7 + 0xc);
        uVar7 = (ulong)(uVar6 >> 3);
        gcFrame.analyzedArgumentsNode = sysbvm_array_create(context,uVar7);
        if (7 < uVar6) {
          uVar5 = 0;
          do {
            uVar2 = (gcFrame.sourceDefinition)->argumentNodes;
            if ((uVar2 & 0xf) == 0 && uVar2 != 0) {
              gcFrame.analyzedArgumentNode = *(sysbvm_tuple_t *)(uVar2 + 0x10 + uVar5 * 8);
            }
            else {
              gcFrame.analyzedArgumentNode = 0;
            }
            gcFrame.analyzedArgumentNode =
                 sysbvm_interpreter_analyzeASTIfNeededWithEnvironment
                           (context,gcFrame.analyzedArgumentNode,gcFrame.analysisEnvironment);
            if ((gcFrame.analyzedArgumentsNode & 0xf) == 0 && gcFrame.analyzedArgumentsNode != 0) {
              *(sysbvm_tuple_t *)(gcFrame.analyzedArgumentsNode + 0x10 + uVar5 * 8) =
                   gcFrame.analyzedArgumentNode;
            }
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
      }
      if ((gcFrame.sourceDefinition)->resultTypeNode != 0) {
        gcFrame.analyzedResultTypeNode =
             sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                       (context,(gcFrame.sourceDefinition)->resultTypeNode,(context->roots).typeType
                        ,gcFrame.analysisEnvironment);
      }
      resultTypeNode = gcFrame.analyzedResultTypeNode;
      argumentNodes = gcFrame.analyzedArgumentsNode;
      sVar1 = gcFrame.analysisEnvironment;
      uVar7 = (*functionDefinition)->flags;
      if (uVar7 == 0 || (uVar7 & 0xf) != 0) {
        uVar6 = (uint)((long)uVar7 >> 4);
      }
      else {
        uVar6 = (uint)*(undefined8 *)(uVar7 + 0x10);
      }
      captureBindings =
           sysbvm_orderedCollection_asArray
                     (context,(gcFrame.analysisEnvironmentObject)->captureBindingList);
      argumentBindings =
           sysbvm_orderedCollection_asArray
                     (context,(gcFrame.analysisEnvironmentObject)->argumentBindingList);
      localBindings =
           sysbvm_orderedCollection_asArray
                     (context,(gcFrame.analysisEnvironmentObject)->localBindingList);
      gcFrame.analyzedType =
           sysbvm_type_createDependentFunctionType
                     (context,argumentNodes,(ulong)(uVar6 & 0x602),resultTypeNode,sVar1,
                      captureBindings,argumentBindings,localBindings);
      gcFrame.analyzedType = sysbvm_type_canonicalizeFunctionType(context,gcFrame.analyzedType);
      psVar3 = *functionDefinition;
      psVar3->type = gcFrame.analyzedType;
      (gcFrame.sourceAnalyzedDefinition)->environment = gcFrame.analysisEnvironment;
      (gcFrame.sourceAnalyzedDefinition)->argumentNodes = gcFrame.analyzedArgumentsNode;
      (gcFrame.sourceAnalyzedDefinition)->resultTypeNode = gcFrame.analyzedResultTypeNode;
      (gcFrame.analysisEnvironmentObject)->returnTypeExpression = gcFrame.analyzedResultTypeNode;
      psVar3->bytecode = 0;
      psVar3->nativeCodeDefinition = 0;
      sysbvm_stackFrame_popRecord(&local_70);
      sysbvm_stackFrame_popRecord(&local_58);
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionDefinition_ensureTypeAnalysis(sysbvm_context_t *context, sysbvm_functionDefinition_t **functionDefinition)
{
    // Make sure this is a valid function definition for analysis.
    if(!sysbvm_tuple_isKindOf(context, (sysbvm_tuple_t)*functionDefinition, context->roots.functionDefinitionType))
        return;

    sysbvm_functionSourceDefinition_t *sourceDefinition = (sysbvm_functionSourceDefinition_t *)(*functionDefinition)->sourceDefinition;
    if(!sourceDefinition->argumentNodes || !sourceDefinition->bodyNode)
        return;

    // Is it already analyzed?
    if((*functionDefinition)->type)
        return;

    sysbvm_functionDefinition_analyzeType(context, functionDefinition);
}